

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDefinitions
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  FieldGenerator *pFVar5;
  int __c;
  int __c_00;
  long lVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  string *__s;
  allocator<char> local_f1;
  long local_f0;
  FieldGeneratorMap *local_e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_98;
  string local_78;
  char buffer [32];
  
  io::Printer::Print(printer,"// $classname$\n\n","classname",&this->classname_);
  local_e8 = &this->field_generators_;
  local_f0 = 0;
  lVar6 = 0;
  while( true ) {
    if (*(int *)(this->descriptor_ + 0x2c) <= lVar6) break;
    lVar1 = *(long *)(this->descriptor_ + 0x30);
    field = (FieldDescriptor *)(local_f0 + lVar1);
    anon_unknown_0::PrintFieldComment(printer,field);
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    variables = &vars;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    SetCommonFieldVariables(field,variables,&this->options_);
    if (*(int *)(lVar1 + 0x30 + local_f0) == 3) {
      io::Printer::Print(printer,&vars,
                         "inline int $classname$::$name$_size() const {\n  return $name$_.size();\n}\n"
                        );
    }
    else {
      pcVar3 = FieldDescriptor::index(field,(char *)variables,__c);
      uVar2 = (ulong)(uint)((int)pcVar3 >> 0x1f) << 0x20 | (ulong)pcVar3 & 0xffffffff;
      SimpleItoa_abi_cxx11_
                (&local_78,(protobuf *)((long)uVar2 / 0x20 & 0xffffffff),(int)((long)uVar2 % 0x20));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"has_array_index",&local_f1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_98);
      __s = &local_78;
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      pcVar3 = FieldDescriptor::index(field,(char *)__s,__c_00);
      FastHex32ToBuffer(1 << ((byte)pcVar3 & 0x1f),buffer);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"has_mask",(allocator<char> *)&local_98);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_78);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&local_78);
      io::Printer::Print(printer,&vars,
                         "inline bool $classname$::has_$name$() const {\n  return (_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n}\ninline void $classname$::set_has_$name$() {\n  _has_bits_[$has_array_index$] |= 0x$has_mask$u;\n}\ninline void $classname$::clear_has_$name$() {\n  _has_bits_[$has_array_index$] &= ~0x$has_mask$u;\n}\n"
                        );
    }
    io::Printer::Print(printer,&vars,"inline void $classname$::clear_$name$() {\n");
    io::Printer::Indent(printer);
    pFVar5 = FieldGeneratorMap::get(local_e8,field);
    (*pFVar5->_vptr_FieldGenerator[6])(pFVar5,printer);
    io::Printer::Outdent(printer);
    if (*(int *)(lVar1 + 0x30 + local_f0) != 3) {
      io::Printer::Print(printer,&vars,"  clear_has_$name$();\n");
    }
    io::Printer::Print(printer,"}\n");
    pFVar5 = FieldGeneratorMap::get(local_e8,field);
    (*pFVar5->_vptr_FieldGenerator[4])(pFVar5,printer);
    io::Printer::Print(printer,"\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
    lVar6 = lVar6 + 1;
    local_f0 = local_f0 + 0x78;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateFieldAccessorDefinitions(io::Printer* printer) {
  printer->Print("// $classname$\n\n", "classname", classname_);

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    PrintFieldComment(printer, field);

    map<string, string> vars;
    SetCommonFieldVariables(field, &vars, options_);

    // Generate has_$name$() or $name$_size().
    if (field->is_repeated()) {
      printer->Print(vars,
        "inline int $classname$::$name$_size() const {\n"
        "  return $name$_.size();\n"
        "}\n");
    } else {
      // Singular field.
      char buffer[kFastToBufferSize];
      vars["has_array_index"] = SimpleItoa(field->index() / 32);
      vars["has_mask"] = FastHex32ToBuffer(1u << (field->index() % 32), buffer);
      printer->Print(vars,
        "inline bool $classname$::has_$name$() const {\n"
        "  return (_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n"
        "}\n"
        "inline void $classname$::set_has_$name$() {\n"
        "  _has_bits_[$has_array_index$] |= 0x$has_mask$u;\n"
        "}\n"
        "inline void $classname$::clear_has_$name$() {\n"
        "  _has_bits_[$has_array_index$] &= ~0x$has_mask$u;\n"
        "}\n"
        );
    }

    // Generate clear_$name$()
    printer->Print(vars,
      "inline void $classname$::clear_$name$() {\n");

    printer->Indent();
    field_generators_.get(field).GenerateClearingCode(printer);
    printer->Outdent();

    if (!field->is_repeated()) {
      printer->Print(vars,
                     "  clear_has_$name$();\n");
    }

    printer->Print("}\n");

    // Generate type-specific accessors.
    field_generators_.get(field).GenerateInlineAccessorDefinitions(printer);

    printer->Print("\n");
  }
}